

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O3

RunResult __thiscall
wabt::interp::Thread::DoSimdLoadLane<wabt::interp::Simd<unsigned_long,(unsigned_char)2>>
          (Thread *this,Instr instr,Ptr *out_trap)

{
  RunResult RVar1;
  RunResult RVar2;
  Simd<unsigned_long,_(unsigned_char)__x02_> result;
  T val;
  anon_union_16_6_113bff37_for_Value_0 local_28;
  unsigned_long local_18;
  
  local_28.v128_.v = (v128)Pop(this);
  RVar1 = Load<unsigned_long>(this,instr,&local_18,out_trap);
  RVar2 = Trap;
  if (RVar1 == Ok) {
    *(unsigned_long *)((long)&local_28 + (ulong)instr.field_2.imm_v128.v[8] * 8) = local_18;
    Push(this,(Value)local_28.v128_.v);
    RVar2 = Ok;
  }
  return RVar2;
}

Assistant:

RunResult Thread::DoSimdLoadLane(Instr instr, Trap::Ptr* out_trap) {
  using T = typename S::LaneType;
  auto result = Pop<S>();
  T val;
  if (Load<T>(instr, &val, out_trap) != RunResult::Ok) {
    return RunResult::Trap;
  }
  result[instr.imm_u32x2_u8.idx] = val;
  Push(result);
  return RunResult::Ok;
}